

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::base_internal::(anonymous_namespace)::StrErrorInternal_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int errnum)

{
  char *__s;
  allocator<char> local_89;
  char buf [100];
  
  __s = strerror_r((int)this,buf,100);
  if (*__s == '\0') {
    snprintf(buf,100,"Unknown error %d",(ulong)this & 0xffffffff);
    __s = buf;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_89)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string StrErrorInternal(int errnum) {
  char buf[100];
  const char* str = StrErrorAdaptor(errnum, buf, sizeof buf);
  if (*str == '\0') {
    snprintf(buf, sizeof buf, "Unknown error %d", errnum);
    str = buf;
  }
  return str;
}